

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

void csr2dense(CUPDLPdense *dense,CUPDLPcsr *csr)

{
  int iVar1;
  uint uVar2;
  cupdlp_int *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  iVar1 = csr->nRows;
  dense->nRows = iVar1;
  uVar2 = csr->nCols;
  dense->nCols = uVar2;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    lVar6 = 0;
    iVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        pcVar3 = csr->rowMatIdx;
        uVar7 = 0;
        lVar4 = lVar5;
        do {
          if (uVar7 == (uint)pcVar3[iVar8]) {
            *(cupdlp_float *)((long)dense->data + lVar4) = csr->rowMatElem[iVar8];
            iVar8 = iVar8 + 1;
          }
          else {
            *(undefined8 *)((long)dense->data + lVar4) = 0;
          }
          uVar7 = uVar7 + 1;
          lVar4 = lVar4 + 8;
        } while (uVar2 != uVar7);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + (ulong)uVar2 * 8;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

void csr2dense(CUPDLPdense *dense, CUPDLPcsr *csr) {
  dense->nRows = csr->nRows;
  dense->nCols = csr->nCols;

  cupdlp_int iRow = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iMatElem = 0;
  for (iRow = 0; iRow < dense->nRows; ++iRow)
    for (iCol = 0; iCol < dense->nCols; ++iCol) {
      if (iCol == csr->rowMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csr->rowMatElem[iMatElem];
        ++iMatElem;
      } else {
        dense->data[iRow * dense->nCols + iCol] = 0;
      }
    }

  return;
}